

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O0

uint32_t helper2(lzma_lzma1_encoder *coder,uint32_t *reps,uint8_t *buf,uint32_t len_end,
                uint32_t position,uint32_t cur,uint32_t nice_len,uint32_t buf_avail_full)

{
  byte bVar1;
  byte bVar2;
  lzma_lzma_state lVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  uint pos_state_00;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  int iVar9;
  uint32_t uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint uVar18;
  uint uVar19;
  uint64_t uVar20;
  uint64_t uVar21;
  ulong uVar22;
  uint8_t *buf_00;
  bool bVar23;
  lzma_lzma_state local_27c;
  lzma_lzma_state local_278;
  lzma_lzma_state local_26c;
  lzma_lzma_state local_260;
  lzma_lzma_state local_248;
  lzma_lzma_state local_244;
  lzma_lzma_state local_234;
  lzma_lzma_state local_228;
  lzma_lzma_state local_21c;
  lzma_lzma_state local_1fc;
  lzma_lzma_state local_1f8;
  uint local_1f4;
  uint32_t local_1e8;
  lzma_lzma_state local_1e4;
  uint32_t local_1cc;
  uint32_t local_1c8;
  uint32_t local_1c4;
  uint32_t local_1c0;
  uint32_t offset_2;
  uint32_t next_rep_match_price_2;
  uint32_t cur_and_len_literal_price_1;
  uint32_t pos_state_next_2;
  lzma_lzma_state state_2_2;
  uint32_t limit_2;
  uint32_t len_test_2_1;
  uint8_t *buf_back_2;
  uint32_t cur_and_len_price_3;
  uint32_t cur_back;
  uint32_t len_test_3;
  uint32_t i_3;
  uint32_t normal_match_price;
  uint32_t cur_and_len_price_2;
  uint32_t offset_1;
  uint32_t next_rep_match_price_1;
  uint32_t cur_and_len_literal_price;
  uint32_t pos_state_next_1;
  lzma_lzma_state state_2_1;
  uint32_t limit_1;
  uint32_t len_test_2;
  uint32_t cur_and_len_price_1;
  uint32_t price;
  uint32_t len_test_temp;
  uint32_t len_test_1;
  uint8_t *buf_back_1;
  lzma_lzma_state local_140;
  uint32_t rep_index;
  uint32_t start_len;
  uint32_t cur_and_len_price;
  uint32_t offset;
  uint32_t next_rep_match_price;
  uint32_t pos_state_next;
  lzma_lzma_state state_2;
  uint32_t len_test;
  uint32_t limit;
  uint8_t *buf_back;
  uint32_t buf_avail;
  uint32_t short_rep_price;
  uint32_t rep_match_price;
  uint32_t match_price;
  _Bool next_is_literal;
  uint32_t cur_and_1_price;
  uint32_t pos_state;
  uint8_t match_byte;
  uint uStack_f4;
  uint8_t current_byte;
  uint32_t cur_price;
  uint32_t i_2;
  uint32_t i_1;
  uint32_t i;
  uint32_t pos;
  lzma_lzma_state state;
  uint32_t pos_prev;
  uint32_t new_len;
  uint32_t matches_count;
  uint32_t cur_local;
  uint32_t position_local;
  uint32_t len_end_local;
  uint8_t *buf_local;
  uint32_t *reps_local;
  lzma_lzma1_encoder *coder_local;
  uint64_t x_3;
  lzma_lzma_state local_84;
  uint64_t x_2;
  lzma_lzma_state local_5c;
  uint64_t x_1;
  lzma_lzma_state local_34;
  uint64_t x;
  uint local_c;
  
  pos_prev = coder->matches_count;
  state = coder->longest_match_length;
  pos = coder->opts[cur].pos_prev;
  if ((coder->opts[cur].prev_1_is_literal & 1U) == 0) {
    i = coder->opts[pos].state;
  }
  else {
    pos = pos - 1;
    if ((coder->opts[cur].prev_2 & 1U) == 0) {
      i = coder->opts[pos].state;
    }
    else {
      lVar3 = coder->opts[coder->opts[cur].pos_prev_2].state;
      if (coder->opts[cur].back_prev_2 < 4) {
        i = 0xb;
        if (lVar3 < STATE_LIT_MATCH) {
          i = 8;
        }
      }
      else {
        i = 10;
        if (lVar3 < STATE_LIT_MATCH) {
          i = 7;
        }
      }
    }
    if (i < 4) {
      local_1c0 = 0;
    }
    else {
      if (i < 10) {
        local_1c4 = i - 3;
      }
      else {
        local_1c4 = i - 6;
      }
      local_1c0 = local_1c4;
    }
    i = local_1c0;
  }
  if (pos == cur - 1) {
    if (coder->opts[cur].back_prev == 0) {
      bVar23 = i < 7;
      i = 0xb;
      if (bVar23) {
        i = 9;
      }
    }
    else {
      if (i < 4) {
        local_1c8 = 0;
      }
      else {
        if (i < 10) {
          local_1cc = i - 3;
        }
        else {
          local_1cc = i - 6;
        }
        local_1c8 = local_1cc;
      }
      i = local_1c8;
    }
  }
  else {
    if (((coder->opts[cur].prev_1_is_literal & 1U) == 0) || ((coder->opts[cur].prev_2 & 1U) == 0)) {
      i_1 = coder->opts[cur].back_prev;
      if (i_1 < 4) {
        bVar23 = i < 7;
        i = 0xb;
        if (bVar23) {
          i = 8;
        }
      }
      else {
        bVar23 = i < 7;
        i = 10;
        if (bVar23) {
          i = 7;
        }
      }
    }
    else {
      pos = coder->opts[cur].pos_prev_2;
      i_1 = coder->opts[cur].back_prev_2;
      bVar23 = i < 7;
      i = 0xb;
      if (bVar23) {
        i = 8;
      }
    }
    if (i_1 < 4) {
      *reps = coder->opts[pos].backs[i_1];
      for (i_2 = 1; i_2 <= i_1; i_2 = i_2 + 1) {
        reps[i_2] = coder->opts[pos].backs[i_2 - 1];
      }
      for (; i_2 < 4; i_2 = i_2 + 1) {
        reps[i_2] = coder->opts[pos].backs[i_2];
      }
    }
    else {
      *reps = i_1 - 4;
      for (cur_price = 1; cur_price < 4; cur_price = cur_price + 1) {
        reps[cur_price] = coder->opts[pos].backs[cur_price - 1];
      }
    }
  }
  coder->opts[cur].state = i;
  for (uStack_f4 = 0; uStack_f4 < 4; uStack_f4 = uStack_f4 + 1) {
    coder->opts[cur].backs[uStack_f4] = reps[uStack_f4];
  }
  uVar10 = coder->opts[cur].price;
  bVar1 = *buf;
  bVar2 = buf[-1 - (ulong)*reps];
  pos_state_00 = position & coder->pos_mask;
  uVar6 = rc_bit_0_price(coder->is_match[i][pos_state_00]);
  uVar7 = get_literal_price(coder,position,(uint)buf[-1],(_Bool)((i < 7 ^ 0xffU) & 1),(uint)bVar2,
                            (uint)bVar1);
  uVar8 = uVar10 + uVar6 + uVar7;
  rep_match_price._3_1_ = uVar8 < coder->opts[cur + 1].price;
  if (rep_match_price._3_1_) {
    coder->opts[cur + 1].price = uVar8;
    coder->opts[cur + 1].pos_prev = cur;
    make_literal(coder->opts + (cur + 1));
  }
  uVar6 = rc_bit_1_price(coder->is_match[i][pos_state_00]);
  iVar9 = uVar10 + uVar6;
  uVar10 = rc_bit_1_price(coder->is_rep[i]);
  iVar11 = iVar9 + uVar10;
  if ((bVar2 == bVar1) &&
     ((cur <= coder->opts[cur + 1].pos_prev || (coder->opts[cur + 1].back_prev != 0)))) {
    uVar10 = get_short_rep_price(coder,i,pos_state_00);
    uVar12 = iVar11 + uVar10;
    bVar23 = uVar12 <= coder->opts[cur + 1].price;
    if (bVar23) {
      coder->opts[cur + 1].price = uVar12;
      coder->opts[cur + 1].pos_prev = cur;
      make_short_rep(coder->opts + (cur + 1));
    }
    rep_match_price._3_1_ = bVar23 || rep_match_price._3_1_;
  }
  coder_local._4_4_ = len_end;
  if (1 < buf_avail_full) {
    if (buf_avail_full < nice_len) {
      local_1e4 = buf_avail_full;
    }
    else {
      local_1e4 = nice_len;
    }
    cur_local = len_end;
    if ((!rep_match_price._3_1_) && (bVar2 != bVar1)) {
      uVar12 = *reps;
      if (buf_avail_full < nice_len + 1) {
        local_1e8 = buf_avail_full;
      }
      else {
        local_1e8 = nice_len + 1;
      }
      x._4_4_ = 1;
      if (local_1e8 == 0) {
        __assert_fail("len <= limit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2e,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
      if (0x7fffffff < local_1e8) {
        __assert_fail("limit <= UINT32_MAX / 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                      ,0x2f,
                      "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                     );
      }
LAB_00ab7192:
      if (x._4_4_ < local_1e8) {
        uVar20 = read64ne(buf + x._4_4_);
        uVar21 = read64ne(buf + (ulong)x._4_4_ + (-1 - (ulong)uVar12));
        uVar22 = uVar20 - uVar21;
        if (uVar22 == 0) goto LAB_00ab7214;
        uVar12 = 0;
        for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
          uVar12 = uVar12 + 1;
        }
        local_1f4 = (uVar12 >> 3) + x._4_4_;
        if (local_1e8 <= local_1f4) {
          local_1f4 = local_1e8;
        }
        local_c = local_1f4;
      }
      else {
        local_c = local_1e8;
      }
      local_c = local_c - 1;
      if (1 < local_c) {
        if (i < 4) {
          local_1f8 = STATE_LIT_LIT;
        }
        else {
          if (i < 10) {
            local_1fc = i - STATE_SHORTREP_LIT_LIT;
          }
          else {
            local_1fc = i - STATE_SHORTREP_LIT;
          }
          local_1f8 = local_1fc;
        }
        uVar12 = position + 1 & coder->pos_mask;
        uVar10 = rc_bit_1_price(coder->is_match[local_1f8][uVar12]);
        uVar6 = rc_bit_1_price(coder->is_rep[local_1f8]);
        uVar13 = cur + 1 + local_c;
        while (cur_local < uVar13) {
          cur_local = cur_local + 1;
          coder->opts[cur_local].price = 0x40000000;
        }
        uVar7 = get_rep_price(coder,0,local_c,local_1f8,uVar12);
        uVar8 = uVar8 + uVar10 + uVar6 + uVar7;
        if (uVar8 < coder->opts[uVar13].price) {
          coder->opts[uVar13].price = uVar8;
          coder->opts[uVar13].pos_prev = cur + 1;
          coder->opts[uVar13].back_prev = 0;
          coder->opts[uVar13].prev_1_is_literal = true;
          coder->opts[uVar13].prev_2 = false;
        }
      }
    }
    local_140 = STATE_REP_LIT_LIT;
    for (buf_back_1._4_4_ = 0; buf_back_1._4_4_ < 4; buf_back_1._4_4_ = buf_back_1._4_4_ + 1) {
      buf_00 = buf + (-1 - (ulong)reps[buf_back_1._4_4_]);
      uVar4 = read16ne(buf);
      uVar5 = read16ne(buf_00);
      if (uVar4 == uVar5) {
        x_1._4_4_ = STATE_REP_LIT_LIT;
        if (local_1e4 < STATE_REP_LIT_LIT) {
          __assert_fail("len <= limit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2e,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
        if (0x7fffffff < local_1e4) {
          __assert_fail("limit <= UINT32_MAX / 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                        ,0x2f,
                        "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                       );
        }
LAB_00ab758a:
        if (x_1._4_4_ < local_1e4) {
          uVar20 = read64ne(buf + x_1._4_4_);
          uVar21 = read64ne(buf_00 + x_1._4_4_);
          uVar22 = uVar20 - uVar21;
          if (uVar22 == 0) goto LAB_00ab760c;
          uVar8 = 0;
          for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
            uVar8 = uVar8 + 1;
          }
          local_21c = (uVar8 >> 3) + x_1._4_4_;
          if (local_1e4 <= local_21c) {
            local_21c = local_1e4;
          }
          local_34 = local_21c;
        }
        else {
          local_34 = local_1e4;
        }
        price = local_34;
        while (cur_local < cur + local_34) {
          cur_local = cur_local + 1;
          coder->opts[cur_local].price = 0x40000000;
        }
        uVar10 = get_pure_rep_price(coder,buf_back_1._4_4_,i,pos_state_00);
        iVar14 = iVar11 + uVar10;
        do {
          uVar10 = get_len_price(&coder->rep_len_encoder,price,pos_state_00);
          uVar8 = iVar14 + uVar10;
          if (uVar8 < coder->opts[cur + price].price) {
            coder->opts[cur + price].price = uVar8;
            coder->opts[cur + price].pos_prev = cur;
            coder->opts[cur + price].back_prev = buf_back_1._4_4_;
            coder->opts[cur + price].prev_1_is_literal = false;
          }
          price = price - 1;
        } while (1 < price);
        if (buf_back_1._4_4_ == 0) {
          local_140 = local_34 + STATE_MATCH_LIT_LIT;
        }
        state_2_1 = local_34 + STATE_MATCH_LIT_LIT;
        if (buf_avail_full < state_2_1 + nice_len) {
          local_228 = buf_avail_full;
        }
        else {
          local_228 = state_2_1 + nice_len;
        }
        if (state_2_1 < local_228) {
          if (local_228 < state_2_1) {
            __assert_fail("len <= limit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                          ,0x2e,
                          "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                         );
          }
          x_2._4_4_ = state_2_1;
          if (0x7fffffff < local_228) {
            __assert_fail("limit <= UINT32_MAX / 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                          ,0x2f,
                          "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                         );
          }
LAB_00ab78d7:
          if (x_2._4_4_ < local_228) {
            uVar20 = read64ne(buf + x_2._4_4_);
            uVar21 = read64ne(buf_00 + x_2._4_4_);
            uVar22 = uVar20 - uVar21;
            if (uVar22 == 0) goto LAB_00ab7959;
            uVar8 = 0;
            for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
              uVar8 = uVar8 + 1;
            }
            local_234 = (uVar8 >> 3) + x_2._4_4_;
            if (local_228 <= local_234) {
              local_234 = local_228;
            }
            local_5c = local_234;
          }
          else {
            local_5c = local_228;
          }
          state_2_1 = local_5c;
        }
        uVar8 = state_2_1 - (local_34 + STATE_MATCH_LIT_LIT);
        if (1 < uVar8) {
          uVar12 = 0xb;
          if (i < 7) {
            uVar12 = 8;
          }
          uVar13 = coder->pos_mask;
          uVar10 = get_len_price(&coder->rep_len_encoder,local_34,pos_state_00);
          uVar6 = rc_bit_0_price(coder->is_match[uVar12][position + local_34 & uVar13]);
          uVar7 = get_literal_price(coder,position + local_34,
                                    (uint)buf[local_34 - STATE_MATCH_LIT_LIT],true,
                                    (uint)buf_00[local_34],(uint)buf[local_34]);
          if (uVar12 < 4) {
            local_244 = STATE_LIT_LIT;
          }
          else {
            if (uVar12 < 10) {
              local_248 = uVar12 - STATE_SHORTREP_LIT_LIT;
            }
            else {
              local_248 = uVar12 - STATE_SHORTREP_LIT;
            }
            local_244 = local_248;
          }
          uVar12 = position + local_34 + 1 & coder->pos_mask;
          uVar15 = rc_bit_1_price(coder->is_match[local_244][uVar12]);
          uVar16 = rc_bit_1_price(coder->is_rep[local_244]);
          uVar13 = cur + local_34 + 1 + uVar8;
          while (cur_local < uVar13) {
            cur_local = cur_local + 1;
            coder->opts[cur_local].price = 0x40000000;
          }
          uVar17 = get_rep_price(coder,0,uVar8,local_244,uVar12);
          uVar8 = iVar14 + uVar10 + uVar6 + uVar7 + uVar15 + uVar16 + uVar17;
          if (uVar8 < coder->opts[uVar13].price) {
            coder->opts[uVar13].price = uVar8;
            coder->opts[uVar13].pos_prev = cur + local_34 + 1;
            coder->opts[uVar13].back_prev = 0;
            coder->opts[uVar13].prev_1_is_literal = true;
            coder->opts[uVar13].prev_2 = true;
            coder->opts[uVar13].pos_prev_2 = cur;
            coder->opts[uVar13].back_prev_2 = buf_back_1._4_4_;
          }
        }
      }
    }
    if (local_1e4 < state) {
      state = local_1e4;
      pos_prev = 0;
      while (coder->matches[pos_prev].len < local_1e4) {
        pos_prev = pos_prev + 1;
      }
      coder->matches[pos_prev].len = local_1e4;
      pos_prev = pos_prev + 1;
    }
    if (local_140 <= state) {
      uVar10 = rc_bit_0_price(coder->is_rep[i]);
      while (cur_local < cur + state) {
        cur_local = cur_local + 1;
        coder->opts[cur_local].price = 0x40000000;
      }
      cur_back = 0;
      while (coder->matches[cur_back].len < local_140) {
        cur_back = cur_back + 1;
      }
      cur_and_len_price_3 = local_140;
      do {
        uVar8 = coder->matches[cur_back].dist;
        uVar6 = get_dist_len_price(coder,uVar8,cur_and_len_price_3,pos_state_00);
        uVar12 = iVar9 + uVar10 + uVar6;
        if (uVar12 < coder->opts[cur + cur_and_len_price_3].price) {
          coder->opts[cur + cur_and_len_price_3].price = uVar12;
          coder->opts[cur + cur_and_len_price_3].pos_prev = cur;
          coder->opts[cur + cur_and_len_price_3].back_prev = uVar8 + 4;
          coder->opts[cur + cur_and_len_price_3].prev_1_is_literal = false;
        }
        if (cur_and_len_price_3 == coder->matches[cur_back].len) {
          state_2_2 = cur_and_len_price_3 + STATE_MATCH_LIT_LIT;
          if (buf_avail_full < state_2_2 + nice_len) {
            local_260 = buf_avail_full;
          }
          else {
            local_260 = state_2_2 + nice_len;
          }
          if (state_2_2 < local_260) {
            if (local_260 < state_2_2) {
              __assert_fail("len <= limit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                            ,0x2e,
                            "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                           );
            }
            x_3._4_4_ = state_2_2;
            if (0x7fffffff < local_260) {
              __assert_fail("limit <= UINT32_MAX / 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                            ,0x2f,
                            "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                           );
            }
LAB_00ab8109:
            if (x_3._4_4_ < local_260) {
              uVar20 = read64ne(buf + x_3._4_4_);
              uVar21 = read64ne(buf + (ulong)x_3._4_4_ + (-1 - (ulong)uVar8));
              uVar22 = uVar20 - uVar21;
              if (uVar22 == 0) goto LAB_00ab81b8;
              uVar13 = 0;
              for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                uVar13 = uVar13 + 1;
              }
              local_26c = (uVar13 >> 3) + x_3._4_4_;
              if (local_260 <= local_26c) {
                local_26c = local_260;
              }
              local_84 = local_26c;
            }
            else {
              local_84 = local_260;
            }
            state_2_2 = local_84;
          }
          uVar13 = state_2_2 - (cur_and_len_price_3 + 1);
          if (1 < uVar13) {
            uVar19 = 10;
            if (i < 7) {
              uVar19 = 7;
            }
            uVar18 = position + cur_and_len_price_3 & coder->pos_mask;
            uVar6 = rc_bit_0_price(coder->is_match[uVar19][uVar18]);
            uVar7 = get_literal_price(coder,position + cur_and_len_price_3,
                                      (uint)buf[cur_and_len_price_3 - 1],true,
                                      (uint)buf[(ulong)cur_and_len_price_3 + (-1 - (ulong)uVar8)],
                                      (uint)buf[cur_and_len_price_3]);
            if (uVar19 < 4) {
              local_278 = STATE_LIT_LIT;
            }
            else {
              if (uVar19 < 10) {
                local_27c = uVar19 - STATE_SHORTREP_LIT_LIT;
              }
              else {
                local_27c = uVar19 - STATE_SHORTREP_LIT;
              }
              local_278 = local_27c;
            }
            uVar19 = uVar18 + 1 & coder->pos_mask;
            uVar15 = rc_bit_1_price(coder->is_match[local_278][uVar19]);
            uVar16 = rc_bit_1_price(coder->is_rep[local_278]);
            uVar18 = cur + cur_and_len_price_3 + 1 + uVar13;
            while (cur_local < uVar18) {
              cur_local = cur_local + 1;
              coder->opts[cur_local].price = 0x40000000;
            }
            uVar17 = get_rep_price(coder,0,uVar13,local_278,uVar19);
            uVar12 = uVar12 + uVar6 + uVar7 + uVar15 + uVar16 + uVar17;
            if (uVar12 < coder->opts[uVar18].price) {
              coder->opts[uVar18].price = uVar12;
              coder->opts[uVar18].pos_prev = cur + cur_and_len_price_3 + 1;
              coder->opts[uVar18].back_prev = 0;
              coder->opts[uVar18].prev_1_is_literal = true;
              coder->opts[uVar18].prev_2 = true;
              coder->opts[uVar18].pos_prev_2 = cur;
              coder->opts[uVar18].back_prev_2 = uVar8 + 4;
            }
          }
          cur_back = cur_back + 1;
          if (cur_back == pos_prev) break;
        }
        cur_and_len_price_3 = cur_and_len_price_3 + 1;
      } while( true );
    }
    coder_local._4_4_ = cur_local;
  }
  return coder_local._4_4_;
LAB_00ab7214:
  x._4_4_ = x._4_4_ + 8;
  goto LAB_00ab7192;
LAB_00ab760c:
  x_1._4_4_ = x_1._4_4_ + STATE_LIT_LONGREP;
  goto LAB_00ab758a;
LAB_00ab7959:
  x_2._4_4_ = x_2._4_4_ + STATE_LIT_LONGREP;
  goto LAB_00ab78d7;
LAB_00ab81b8:
  x_3._4_4_ = x_3._4_4_ + STATE_LIT_LONGREP;
  goto LAB_00ab8109;
}

Assistant:

static inline uint32_t
helper2(lzma_lzma1_encoder *coder, uint32_t *reps, const uint8_t *buf,
		uint32_t len_end, uint32_t position, const uint32_t cur,
		const uint32_t nice_len, const uint32_t buf_avail_full)
{
	uint32_t matches_count = coder->matches_count;
	uint32_t new_len = coder->longest_match_length;
	uint32_t pos_prev = coder->opts[cur].pos_prev;
	lzma_lzma_state state;

	if (coder->opts[cur].prev_1_is_literal) {
		--pos_prev;

		if (coder->opts[cur].prev_2) {
			state = coder->opts[coder->opts[cur].pos_prev_2].state;

			if (coder->opts[cur].back_prev_2 < REPS)
				update_long_rep(state);
			else
				update_match(state);

		} else {
			state = coder->opts[pos_prev].state;
		}

		update_literal(state);

	} else {
		state = coder->opts[pos_prev].state;
	}

	if (pos_prev == cur - 1) {
		if (is_short_rep(coder->opts[cur]))
			update_short_rep(state);
		else
			update_literal(state);
	} else {
		uint32_t pos;
		if (coder->opts[cur].prev_1_is_literal
				&& coder->opts[cur].prev_2) {
			pos_prev = coder->opts[cur].pos_prev_2;
			pos = coder->opts[cur].back_prev_2;
			update_long_rep(state);
		} else {
			pos = coder->opts[cur].back_prev;
			if (pos < REPS)
				update_long_rep(state);
			else
				update_match(state);
		}

		if (pos < REPS) {
			reps[0] = coder->opts[pos_prev].backs[pos];

			uint32_t i;
			for (i = 1; i <= pos; ++i)
				reps[i] = coder->opts[pos_prev].backs[i - 1];

			for (; i < REPS; ++i)
				reps[i] = coder->opts[pos_prev].backs[i];

		} else {
			reps[0] = pos - REPS;

			for (uint32_t i = 1; i < REPS; ++i)
				reps[i] = coder->opts[pos_prev].backs[i - 1];
		}
	}

	coder->opts[cur].state = state;

	for (uint32_t i = 0; i < REPS; ++i)
		coder->opts[cur].backs[i] = reps[i];

	const uint32_t cur_price = coder->opts[cur].price;

	const uint8_t current_byte = *buf;
	const uint8_t match_byte = *(buf - reps[0] - 1);

	const uint32_t pos_state = position & coder->pos_mask;

	const uint32_t cur_and_1_price = cur_price
			+ rc_bit_0_price(coder->is_match[state][pos_state])
			+ get_literal_price(coder, position, buf[-1],
			!is_literal_state(state), match_byte, current_byte);

	bool next_is_literal = false;

	if (cur_and_1_price < coder->opts[cur + 1].price) {
		coder->opts[cur + 1].price = cur_and_1_price;
		coder->opts[cur + 1].pos_prev = cur;
		make_literal(&coder->opts[cur + 1]);
		next_is_literal = true;
	}

	const uint32_t match_price = cur_price
			+ rc_bit_1_price(coder->is_match[state][pos_state]);
	const uint32_t rep_match_price = match_price
			+ rc_bit_1_price(coder->is_rep[state]);

	if (match_byte == current_byte
			&& !(coder->opts[cur + 1].pos_prev < cur
				&& coder->opts[cur + 1].back_prev == 0)) {

		const uint32_t short_rep_price = rep_match_price
				+ get_short_rep_price(coder, state, pos_state);

		if (short_rep_price <= coder->opts[cur + 1].price) {
			coder->opts[cur + 1].price = short_rep_price;
			coder->opts[cur + 1].pos_prev = cur;
			make_short_rep(&coder->opts[cur + 1]);
			next_is_literal = true;
		}
	}

	if (buf_avail_full < 2)
		return len_end;

	const uint32_t buf_avail = my_min(buf_avail_full, nice_len);

	if (!next_is_literal && match_byte != current_byte) { // speed optimization
		// try literal + rep0
		const uint8_t *const buf_back = buf - reps[0] - 1;
		const uint32_t limit = my_min(buf_avail_full, nice_len + 1);

		const uint32_t len_test = lzma_memcmplen(buf, buf_back, 1, limit) - 1;

		if (len_test >= 2) {
			lzma_lzma_state state_2 = state;
			update_literal(state_2);

			const uint32_t pos_state_next = (position + 1) & coder->pos_mask;
			const uint32_t next_rep_match_price = cur_and_1_price
					+ rc_bit_1_price(coder->is_match[state_2][pos_state_next])
					+ rc_bit_1_price(coder->is_rep[state_2]);

			//for (; len_test >= 2; --len_test) {
			const uint32_t offset = cur + 1 + len_test;

			while (len_end < offset)
				coder->opts[++len_end].price = RC_INFINITY_PRICE;

			const uint32_t cur_and_len_price = next_rep_match_price
					+ get_rep_price(coder, 0, len_test,
						state_2, pos_state_next);

			if (cur_and_len_price < coder->opts[offset].price) {
				coder->opts[offset].price = cur_and_len_price;
				coder->opts[offset].pos_prev = cur + 1;
				coder->opts[offset].back_prev = 0;
				coder->opts[offset].prev_1_is_literal = true;
				coder->opts[offset].prev_2 = false;
			}
			//}
		}
	}


	uint32_t start_len = 2; // speed optimization

	for (uint32_t rep_index = 0; rep_index < REPS; ++rep_index) {
		const uint8_t *const buf_back = buf - reps[rep_index] - 1;
		if (not_equal_16(buf, buf_back))
			continue;

		uint32_t len_test = lzma_memcmplen(buf, buf_back, 2, buf_avail);

		while (len_end < cur + len_test)
			coder->opts[++len_end].price = RC_INFINITY_PRICE;

		const uint32_t len_test_temp = len_test;
		const uint32_t price = rep_match_price + get_pure_rep_price(
				coder, rep_index, state, pos_state);

		do {
			const uint32_t cur_and_len_price = price
					+ get_len_price(&coder->rep_len_encoder,
							len_test, pos_state);

			if (cur_and_len_price < coder->opts[cur + len_test].price) {
				coder->opts[cur + len_test].price = cur_and_len_price;
				coder->opts[cur + len_test].pos_prev = cur;
				coder->opts[cur + len_test].back_prev = rep_index;
				coder->opts[cur + len_test].prev_1_is_literal = false;
			}
		} while (--len_test >= 2);

		len_test = len_test_temp;

		if (rep_index == 0)
			start_len = len_test + 1;


		uint32_t len_test_2 = len_test + 1;
		const uint32_t limit = my_min(buf_avail_full,
				len_test_2 + nice_len);
		// NOTE: len_test_2 may be greater than limit so the call to
		// lzma_memcmplen() must be done conditionally.
		if (len_test_2 < limit)
			len_test_2 = lzma_memcmplen(buf, buf_back, len_test_2, limit);

		len_test_2 -= len_test + 1;

		if (len_test_2 >= 2) {
			lzma_lzma_state state_2 = state;
			update_long_rep(state_2);

			uint32_t pos_state_next = (position + len_test) & coder->pos_mask;

			const uint32_t cur_and_len_literal_price = price
					+ get_len_price(&coder->rep_len_encoder,
						len_test, pos_state)
					+ rc_bit_0_price(coder->is_match[state_2][pos_state_next])
					+ get_literal_price(coder, position + len_test,
						buf[len_test - 1], true,
						buf_back[len_test], buf[len_test]);

			update_literal(state_2);

			pos_state_next = (position + len_test + 1) & coder->pos_mask;

			const uint32_t next_rep_match_price = cur_and_len_literal_price
					+ rc_bit_1_price(coder->is_match[state_2][pos_state_next])
					+ rc_bit_1_price(coder->is_rep[state_2]);

			//for(; len_test_2 >= 2; len_test_2--) {
			const uint32_t offset = cur + len_test + 1 + len_test_2;

			while (len_end < offset)
				coder->opts[++len_end].price = RC_INFINITY_PRICE;

			const uint32_t cur_and_len_price = next_rep_match_price
					+ get_rep_price(coder, 0, len_test_2,
						state_2, pos_state_next);

			if (cur_and_len_price < coder->opts[offset].price) {
				coder->opts[offset].price = cur_and_len_price;
				coder->opts[offset].pos_prev = cur + len_test + 1;
				coder->opts[offset].back_prev = 0;
				coder->opts[offset].prev_1_is_literal = true;
				coder->opts[offset].prev_2 = true;
				coder->opts[offset].pos_prev_2 = cur;
				coder->opts[offset].back_prev_2 = rep_index;
			}
			//}
		}
	}


	//for (uint32_t len_test = 2; len_test <= new_len; ++len_test)
	if (new_len > buf_avail) {
		new_len = buf_avail;

		matches_count = 0;
		while (new_len > coder->matches[matches_count].len)
			++matches_count;

		coder->matches[matches_count++].len = new_len;
	}


	if (new_len >= start_len) {
		const uint32_t normal_match_price = match_price
				+ rc_bit_0_price(coder->is_rep[state]);

		while (len_end < cur + new_len)
			coder->opts[++len_end].price = RC_INFINITY_PRICE;

		uint32_t i = 0;
		while (start_len > coder->matches[i].len)
			++i;

		for (uint32_t len_test = start_len; ; ++len_test) {
			const uint32_t cur_back = coder->matches[i].dist;
			uint32_t cur_and_len_price = normal_match_price
					+ get_dist_len_price(coder,
						cur_back, len_test, pos_state);

			if (cur_and_len_price < coder->opts[cur + len_test].price) {
				coder->opts[cur + len_test].price = cur_and_len_price;
				coder->opts[cur + len_test].pos_prev = cur;
				coder->opts[cur + len_test].back_prev
						= cur_back + REPS;
				coder->opts[cur + len_test].prev_1_is_literal = false;
			}

			if (len_test == coder->matches[i].len) {
				// Try Match + Literal + Rep0
				const uint8_t *const buf_back = buf - cur_back - 1;
				uint32_t len_test_2 = len_test + 1;
				const uint32_t limit = my_min(buf_avail_full,
						len_test_2 + nice_len);

				// NOTE: len_test_2 may be greater than limit
				// so the call to lzma_memcmplen() must be
				// done conditionally.
				if (len_test_2 < limit)
					len_test_2 = lzma_memcmplen(buf, buf_back,
							len_test_2, limit);

				len_test_2 -= len_test + 1;

				if (len_test_2 >= 2) {
					lzma_lzma_state state_2 = state;
					update_match(state_2);
					uint32_t pos_state_next
							= (position + len_test) & coder->pos_mask;

					const uint32_t cur_and_len_literal_price = cur_and_len_price
							+ rc_bit_0_price(
								coder->is_match[state_2][pos_state_next])
							+ get_literal_price(coder,
								position + len_test,
								buf[len_test - 1],
								true,
								buf_back[len_test],
								buf[len_test]);

					update_literal(state_2);
					pos_state_next = (pos_state_next + 1) & coder->pos_mask;

					const uint32_t next_rep_match_price
							= cur_and_len_literal_price
							+ rc_bit_1_price(
								coder->is_match[state_2][pos_state_next])
							+ rc_bit_1_price(coder->is_rep[state_2]);

					// for(; len_test_2 >= 2; --len_test_2) {
					const uint32_t offset = cur + len_test + 1 + len_test_2;

					while (len_end < offset)
						coder->opts[++len_end].price = RC_INFINITY_PRICE;

					cur_and_len_price = next_rep_match_price
							+ get_rep_price(coder, 0, len_test_2,
								state_2, pos_state_next);

					if (cur_and_len_price < coder->opts[offset].price) {
						coder->opts[offset].price = cur_and_len_price;
						coder->opts[offset].pos_prev = cur + len_test + 1;
						coder->opts[offset].back_prev = 0;
						coder->opts[offset].prev_1_is_literal = true;
						coder->opts[offset].prev_2 = true;
						coder->opts[offset].pos_prev_2 = cur;
						coder->opts[offset].back_prev_2
								= cur_back + REPS;
					}
					//}
				}

				if (++i == matches_count)
					break;
			}
		}
	}

	return len_end;
}